

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O3

QDataStream *
QtPrivate::readAssociativeContainer<QHash<QFont::Tag,unsigned_int>>
          (QDataStream *s,QHash<QFont::Tag,_unsigned_int> *c)

{
  QDataStream QVar1;
  char cVar2;
  undefined1 *puVar3;
  long in_FS_OFFSET;
  mapped_type_conflict1 t;
  quint32 first;
  uint local_4c;
  undefined1 *local_48;
  Tag local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar1 = s[0x13];
  cVar2 = QDataStream::isDeviceTransactionStarted();
  if (cVar2 == '\0') {
    QDataStream::resetStatus();
  }
  QHash<QFont::Tag,_unsigned_int>::clear(c);
  local_3c.m_value = 0xaaaaaaaa;
  QDataStream::operator>>(s,(int *)&local_3c);
  puVar3 = (undefined1 *)(ulong)local_3c.m_value;
  if (puVar3 == (undefined1 *)0xfffffffe) {
    if (0x15 < *(int *)(s + 0x18)) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      QDataStream::operator>>(s,(longlong *)&local_48);
      puVar3 = local_48;
      if ((long)local_48 < 0) goto LAB_0048ec06;
    }
  }
  else if (local_3c.m_value == 0xffffffff) {
LAB_0048ec06:
    QDataStream::setStatus((Status)s);
    goto LAB_0048eca8;
  }
  if (puVar3 != (undefined1 *)0x0) {
    do {
      local_3c.m_value = 0;
      local_4c = 0xaaaaaaaa;
      ::operator>>(s,&local_3c);
      QDataStream::operator>>(s,(int *)&local_4c);
      if (s[0x13] != (QDataStream)0x0) {
        QHash<QFont::Tag,_unsigned_int>::clear(c);
        break;
      }
      local_48 = (undefined1 *)CONCAT44(local_48._4_4_,local_3c.m_value);
      QHash<QFont::Tag,unsigned_int>::emplace<unsigned_int_const&>
                ((QHash<QFont::Tag,unsigned_int> *)c,(Tag *)&local_48,&local_4c);
      puVar3 = puVar3 + -1;
    } while (puVar3 != (undefined1 *)0x0);
  }
LAB_0048eca8:
  if (QVar1 != (QDataStream)0x0) {
    QDataStream::resetStatus();
    QDataStream::setStatus((Status)s);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return s;
}

Assistant:

QDataStream &readAssociativeContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::key_type k;
        typename Container::mapped_type t;
        s >> k >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.insert(k, t);
    }

    return s;
}